

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint n,uint m)

{
  size_t sVar1;
  uint local_40;
  uint local_3c;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint m_local;
  uint n_local;
  Stack<rapidjson::CrtAllocator> *operandStack_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if (m < n) {
    __assert_fail("n <= m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                  ,0x19c,
                  "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  sVar1 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
  if (sVar1 < 0xc) {
    __assert_fail("operandStack.GetSize() >= sizeof(Frag)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                  ,0x19d,
                  "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (n == 0) {
    if (m == 0) {
      this_local._7_1_ = false;
    }
    else {
      if (m == 0xffffffff) {
        Eval(this,operandStack,kZeroOrMore);
      }
      else {
        Eval(this,operandStack,kZeroOrOne);
        for (i_2 = 0; i_2 < m - 1; i_2 = i_2 + 1) {
          CloneTopOperand(this,operandStack);
        }
        for (i_3 = 0; i_3 < m - 1; i_3 = i_3 + 1) {
          Eval(this,operandStack,kConcatenation);
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    for (i_4 = 0; i_4 < n - 1; i_4 = i_4 + 1) {
      CloneTopOperand(this,operandStack);
    }
    if (m == 0xffffffff) {
      Eval(this,operandStack,kOneOrMore);
    }
    else if (n < m) {
      CloneTopOperand(this,operandStack);
      Eval(this,operandStack,kZeroOrOne);
      for (i_5 = n; local_3c = n, i_5 < m - 1; i_5 = i_5 + 1) {
        CloneTopOperand(this,operandStack);
      }
      for (; local_3c < m; local_3c = local_3c + 1) {
        Eval(this,operandStack,kConcatenation);
      }
    }
    for (local_40 = 0; local_40 < n - 1; local_40 = local_40 + 1) {
      Eval(this,operandStack,kConcatenation);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EvalQuantifier(Stack<Allocator>& operandStack, unsigned n, unsigned m) {
        RAPIDJSON_ASSERT(n <= m);
        RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag));

        if (n == 0) {
            if (m == 0)                             // a{0} not support
                return false;
            else if (m == kInfinityQuantifier)
                Eval(operandStack, kZeroOrMore);    // a{0,} -> a*
            else {
                Eval(operandStack, kZeroOrOne);         // a{0,5} -> a?
                for (unsigned i = 0; i < m - 1; i++)
                    CloneTopOperand(operandStack);      // a{0,5} -> a? a? a? a? a?
                for (unsigned i = 0; i < m - 1; i++)
                    Eval(operandStack, kConcatenation); // a{0,5} -> a?a?a?a?a?
            }
            return true;
        }

        for (unsigned i = 0; i < n - 1; i++)        // a{3} -> a a a
            CloneTopOperand(operandStack);

        if (m == kInfinityQuantifier)
            Eval(operandStack, kOneOrMore);         // a{3,} -> a a a+
        else if (m > n) {
            CloneTopOperand(operandStack);          // a{3,5} -> a a a a
            Eval(operandStack, kZeroOrOne);         // a{3,5} -> a a a a?
            for (unsigned i = n; i < m - 1; i++)
                CloneTopOperand(operandStack);      // a{3,5} -> a a a a? a?
            for (unsigned i = n; i < m; i++)
                Eval(operandStack, kConcatenation); // a{3,5} -> a a aa?a?
        }

        for (unsigned i = 0; i < n - 1; i++)
            Eval(operandStack, kConcatenation);     // a{3} -> aaa, a{3,} -> aaa+, a{3.5} -> aaaa?a?

        return true;
    }